

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NormalizerValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)607>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  undefined8 interface_00;
  bool bVar1;
  int32_t modelVersion;
  CoreML *pCVar2;
  Normalizer *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_161;
  string local_160;
  Normalizer_NormType local_13c;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_135;
  Normalizer_NormType normLx;
  iterator local_130;
  size_type local_128;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_120;
  Result local_108;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_dd;
  TypeCase local_dc;
  iterator local_d8;
  size_type local_d0;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c8;
  Result local_b0;
  undefined4 local_84;
  ValidationPolicy local_80 [4];
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  ValidationPolicy::ValidationPolicy(local_80);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion,local_80);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    pCVar2 = (CoreML *)
             Specification::ModelDescription::input
                       ((ModelDescription *)result.m_message.field_2._8_8_);
    local_dc = kMultiArrayType;
    local_d8 = &local_dc;
    local_d0 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_dd);
    __l_00._M_len = local_d0;
    __l_00._M_array = local_d8;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c8,__l_00,&local_dd);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_b0,pCVar2,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_c8,in_R8);
    Result::operator=((Result *)local_48,&local_b0);
    Result::~Result(&local_b0);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c8);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_dd);
    bVar1 = Result::good((Result *)local_48);
    if (bVar1) {
      pCVar2 = (CoreML *)
               Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_);
      normLx = 5;
      local_130 = (iterator)&normLx;
      local_128 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_135);
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_120,__l,&local_135);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_108,pCVar2,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_120,
                 in_R8);
      Result::operator=((Result *)local_48,&local_108);
      Result::~Result(&local_108);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_120);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_135);
      bVar1 = Result::good((Result *)local_48);
      if (bVar1) {
        this = Specification::Model::normalizer(format);
        local_13c = Specification::Normalizer::normtype(this);
        if (((local_13c == Normalizer_NormType_L1) || (local_13c == Normalizer_NormType_L2)) ||
           (local_13c == Normalizer_NormType_LMax)) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"NormalizerValidator normLx invalid",&local_161);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  local_84 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_normalizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        auto normLx = format.normalizer().normtype();
        if (normLx != Specification::Normalizer_NormType::Normalizer_NormType_L1 &&
            normLx != Specification::Normalizer_NormType::Normalizer_NormType_L2 &&
            normLx != Specification::Normalizer_NormType::Normalizer_NormType_LMax) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "NormalizerValidator normLx invalid");
        }
        
        return result;
    }